

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void genIR(void)

{
  char cVar1;
  ast *paVar2;
  ast *paVar3;
  ast *a;
  char *pcVar4;
  allocator local_291;
  ast *local_290;
  ast *local_288;
  undefined1 local_280 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream out;
  
  paVar2 = child(ast_root,1);
  while ((paVar2 != (ast *)0x0 && (paVar2->type != -1))) {
    local_288 = paVar2;
    local_290 = child(paVar2,1);
    paVar2 = child(local_290,2);
    paVar3 = child(paVar2,1);
    a = child(paVar2,3);
    if (paVar2->type != -0x2707) {
      std::operator<<((ostream *)&std::cerr,"Global definition or structure not implemented!\n");
      exit(1);
    }
    Operand::Operand((Operand *)local_280,paVar3->lex);
    IrSim::icFunction((InterCode *)&out,&irSim,(Operand *)local_280);
    IrSim::commitIc(&irSim,(InterCode *)&out);
    InterCode::~InterCode((InterCode *)&out);
    std::__cxx11::string::~string((string *)(local_280 + 8));
    for (; (a != (ast *)0x0 && (a->type == -0x2706)); a = child(a,3)) {
      paVar2 = child(a,1);
      paVar2 = child(paVar2,2);
      pcVar4 = TR_VarDec(paVar2,(int *)0x0);
      Operand::Operand((Operand *)local_280,pcVar4);
      IrSim::icParam((InterCode *)&out,&irSim,(Operand *)local_280);
      IrSim::commitIc(&irSim,(InterCode *)&out);
      InterCode::~InterCode((InterCode *)&out);
      std::__cxx11::string::~string((string *)(local_280 + 8));
    }
    paVar2 = child(local_290,3);
    TR_CompSt(paVar2);
    paVar2 = child(local_288,2);
  }
  IrSim::optimize(&irSim);
  pcVar4 = output_file;
  std::__cxx11::string::string((string *)&local_250,".ir",&local_291);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                 pcVar4,&local_250);
  std::ofstream::ofstream(&out,(string *)local_280,_S_out);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string((string *)&local_250);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    IrSim::printStream(&irSim,(ostream *)&out);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void genIR() {
#if COMPILER_VERSION >= 3
    ast *node = child(ast_root, 1);
    while (node && node->type != NullNode) {
        ast *ext = child(node, 1), *func = child(ext, 2), *id = child(func, 1), *var = child(func, 3);
        if (func->type != FunDec)
            IMP_ME("Global definition or structure");
        irSim << irSim.icFunction(id->lex);
        while (var && var->type == VarList) {
            irSim << irSim.icParam(TR_VarDec(child(child(var, 1), 2)));
            var = child(var, 3);
        }
        TR_CompSt(child(ext, 3));
        node = child(node, 2);
    }
//    irSim.printStream(cout);
#if COMPILER_VERSION == 3
    ofstream out(output_file + string(".orig.ir"));
    if (out.is_open()) {
        irSim.printStream(out);
        out.close();
    }
#endif

    irSim.optimize();

#if COMPILER_VERSION == 3
    out.open(output_file);
#elif COMPILER_VERSION > 3
    ofstream out(output_file + string(".ir"));
#endif
    if (out.is_open()) {
        irSim.printStream(out);
        out.close();
    }
#if COMPILER_VERSION == 3
    else {
        cerr << "ERROR: Cannot open " << output_file << endl;
    }
#endif

#endif
}